

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_p.h
# Opt level: O3

void QRadialFetchSimd<QSimdSse2>::fetch
               (uint *buffer,uint *end,Operator *op,QSpanData *data,qreal det,qreal delta_det,
               qreal delta_delta_det,qreal b,qreal delta_b)

{
  Spread SVar1;
  short sVar2;
  undefined1 auVar3 [16];
  int i;
  uint uVar4;
  long lVar5;
  long in_FS_OFFSET;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar20;
  float fVar21;
  undefined1 in_XMM10 [16];
  undefined1 auVar18 [16];
  float fVar22;
  undefined1 auVar19 [16];
  short sVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 in_XMM11 [16];
  float fVar27;
  short sVar28;
  Vect_buffer_f b_vec;
  Vect_buffer_f delta_det4_vec;
  Vect_buffer_f det_vec;
  undefined1 local_58 [16];
  uint local_48 [4];
  float local_38 [12];
  long local_8;
  
  auVar15 = _DAT_006be5d0;
  auVar16 = _DAT_006be5c0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38[8] = -NAN;
  local_38[9] = -NAN;
  local_38[10] = -NAN;
  local_38[0xb] = -NAN;
  local_38[4] = -NAN;
  local_38[5] = -NAN;
  local_38[6] = -NAN;
  local_38[7] = -NAN;
  local_38[0] = -NAN;
  local_38[1] = -NAN;
  local_38[2] = -NAN;
  local_38[3] = -NAN;
  lVar5 = 0;
  do {
    local_38[lVar5 + 8] = (float)det;
    local_38[lVar5 + 4] = (float)(delta_det * 4.0);
    local_38[lVar5] = (float)b;
    det = det + delta_det;
    delta_det = delta_det + delta_delta_det;
    b = b + delta_b;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  fVar6 = (float)(delta_delta_det * 16.0);
  fVar7 = (float)(delta_delta_det * 6.0);
  fVar8 = (float)(delta_b * 4.0);
  fVar9 = (float)*(double *)((long)&data->field_23 + 0x30);
  fVar10 = (float)(op->field_16).linear.l;
  uVar4 = -((op->field_16).radial.extended ^ 1);
  SVar1 = (data->field_23).gradient.spread;
  fVar11 = (float)DAT_00677d30;
  fVar12 = DAT_00677d30._4_4_;
  fVar13 = DAT_00677d30._8_4_;
  fVar14 = DAT_00677d30._12_4_;
  if (SVar1 == RepeatSpread) {
    if (buffer < end) {
      do {
        auVar16._4_4_ = local_38[9];
        auVar16._0_4_ = local_38[8];
        auVar16._8_4_ = local_38[10];
        auVar16._12_4_ = local_38[0xb];
        auVar16 = maxps(ZEXT816(0),auVar16);
        auVar16 = sqrtps(auVar16,auVar16);
        fVar24 = auVar16._0_4_ - local_38[0];
        fVar25 = auVar16._4_4_ - local_38[1];
        fVar26 = auVar16._8_4_ - local_38[2];
        fVar27 = auVar16._12_4_ - local_38[3];
        local_48[0] = -(uint)(0.0 < fVar10 * fVar24 + fVar9 && 0.0 < local_38[8]);
        local_48[1] = -(uint)(0.0 < fVar10 * fVar25 + fVar9 && 0.0 < local_38[9]);
        local_48[2] = -(uint)(0.0 < fVar10 * fVar26 + fVar9 && 0.0 < local_38[10]);
        local_48[3] = -(uint)(0.0 < fVar10 * fVar27 + fVar9 && 0.0 < local_38[0xb]);
        local_58._0_8_ =
             CONCAT44((int)(fVar25 * 1023.0 + fVar12),(int)(fVar24 * 1023.0 + fVar11)) &
             0x3ff000003ff;
        local_58._8_4_ = (int)(fVar26 * 1023.0 + fVar13) & 0x3ff;
        local_58._12_4_ = (int)(fVar27 * 1023.0 + fVar14) & 0x3ff;
        local_38[8] = local_38[8] + local_38[4] + fVar7;
        local_38[9] = local_38[9] + local_38[5] + fVar7;
        local_38[10] = local_38[10] + local_38[6] + fVar7;
        local_38[0xb] = local_38[0xb] + local_38[7] + fVar7;
        local_38[4] = local_38[4] + fVar6;
        local_38[5] = local_38[5] + fVar6;
        local_38[6] = local_38[6] + fVar6;
        local_38[7] = local_38[7] + fVar6;
        local_38[0] = local_38[0] + fVar8;
        local_38[1] = local_38[1] + fVar8;
        local_38[2] = local_38[2] + fVar8;
        local_38[3] = local_38[3] + fVar8;
        lVar5 = 0;
        do {
          *(uint *)((long)buffer + lVar5) =
               (*(uint *)((long)local_48 + lVar5) | uVar4) &
               (data->field_23).gradient.colorTable32[*(int *)(local_58 + lVar5)];
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x10);
        buffer = buffer + 4;
      } while (buffer < end);
    }
  }
  else if (SVar1 == ReflectSpread) {
    if (buffer < end) {
      do {
        auVar3._4_4_ = local_38[9];
        auVar3._0_4_ = local_38[8];
        auVar3._8_4_ = local_38[10];
        auVar3._12_4_ = local_38[0xb];
        auVar16 = maxps(ZEXT816(0),auVar3);
        auVar16 = sqrtps(in_XMM11,auVar16);
        fVar24 = auVar16._0_4_ - local_38[0];
        fVar25 = auVar16._4_4_ - local_38[1];
        fVar26 = auVar16._8_4_ - local_38[2];
        fVar27 = auVar16._12_4_ - local_38[3];
        local_48[0] = -(uint)(0.0 < fVar10 * fVar24 + fVar9 && 0.0 < local_38[8]);
        local_48[1] = -(uint)(0.0 < fVar10 * fVar25 + fVar9 && 0.0 < local_38[9]);
        local_48[2] = -(uint)(0.0 < fVar10 * fVar26 + fVar9 && 0.0 < local_38[10]);
        local_48[3] = -(uint)(0.0 < fVar10 * fVar27 + fVar9 && 0.0 < local_38[0xb]);
        auVar18._0_4_ = (int)(fVar24 * 1023.0 + fVar11);
        auVar18._4_4_ = (int)(fVar25 * 1023.0 + fVar12);
        auVar18._8_4_ = (int)(fVar26 * 1023.0 + fVar13);
        auVar18._12_4_ = (int)(fVar27 * 1023.0 + fVar14);
        auVar18 = auVar18 & auVar15;
        auVar16 = auVar18 ^ auVar15;
        sVar2 = auVar18._0_2_;
        sVar23 = auVar16._0_2_;
        in_XMM11._0_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
        sVar2 = auVar18._2_2_;
        sVar23 = auVar16._2_2_;
        in_XMM11._2_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
        sVar2 = auVar18._4_2_;
        sVar23 = auVar16._4_2_;
        in_XMM11._4_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
        sVar2 = auVar18._6_2_;
        sVar23 = auVar16._6_2_;
        in_XMM11._6_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
        sVar2 = auVar18._8_2_;
        sVar23 = auVar16._8_2_;
        in_XMM11._8_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
        sVar2 = auVar18._10_2_;
        sVar23 = auVar16._10_2_;
        in_XMM11._10_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
        sVar2 = auVar18._12_2_;
        sVar23 = auVar16._12_2_;
        sVar28 = auVar16._14_2_;
        in_XMM11._12_2_ = (ushort)(sVar2 < sVar23) * sVar2 | (ushort)(sVar2 >= sVar23) * sVar23;
        sVar2 = auVar18._14_2_;
        in_XMM11._14_2_ = (ushort)(sVar2 < sVar28) * sVar2 | (ushort)(sVar2 >= sVar28) * sVar28;
        local_58 = in_XMM11;
        local_38[8] = local_38[8] + local_38[4] + fVar7;
        local_38[9] = local_38[9] + local_38[5] + fVar7;
        local_38[10] = local_38[10] + local_38[6] + fVar7;
        local_38[0xb] = local_38[0xb] + local_38[7] + fVar7;
        local_38[4] = local_38[4] + fVar6;
        local_38[5] = local_38[5] + fVar6;
        local_38[6] = local_38[6] + fVar6;
        local_38[7] = local_38[7] + fVar6;
        local_38[0] = local_38[0] + fVar8;
        local_38[1] = local_38[1] + fVar8;
        local_38[2] = local_38[2] + fVar8;
        local_38[3] = local_38[3] + fVar8;
        lVar5 = 0;
        do {
          *(uint *)((long)buffer + lVar5) =
               (*(uint *)((long)local_48 + lVar5) | uVar4) &
               (data->field_23).gradient.colorTable32[*(int *)(local_58 + lVar5)];
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x10);
        buffer = buffer + 4;
      } while (buffer < end);
    }
  }
  else if (buffer < end) {
    fVar24 = (float)DAT_006be5c0;
    fVar25 = DAT_006be5c0._4_4_;
    fVar26 = DAT_006be5c0._8_4_;
    fVar27 = DAT_006be5c0._12_4_;
    do {
      auVar15._4_4_ = local_38[9];
      auVar15._0_4_ = local_38[8];
      auVar15._8_4_ = local_38[10];
      auVar15._12_4_ = local_38[0xb];
      auVar15 = maxps(ZEXT816(0),auVar15);
      auVar15 = sqrtps(in_XMM10,auVar15);
      fVar17 = auVar15._0_4_ - local_38[0];
      fVar20 = auVar15._4_4_ - local_38[1];
      fVar21 = auVar15._8_4_ - local_38[2];
      fVar22 = auVar15._12_4_ - local_38[3];
      auVar19._0_4_ = fVar17 * fVar24 + fVar11;
      auVar19._4_4_ = fVar20 * fVar25 + fVar12;
      auVar19._8_4_ = fVar21 * fVar26 + fVar13;
      auVar19._12_4_ = fVar22 * fVar27 + fVar14;
      local_48[0] = -(uint)(0.0 < fVar10 * fVar17 + fVar9 && 0.0 < local_38[8]);
      local_48[1] = -(uint)(0.0 < fVar10 * fVar20 + fVar9 && 0.0 < local_38[9]);
      local_48[2] = -(uint)(0.0 < fVar10 * fVar21 + fVar9 && 0.0 < local_38[10]);
      local_48[3] = -(uint)(0.0 < fVar10 * fVar22 + fVar9 && 0.0 < local_38[0xb]);
      auVar15 = maxps(ZEXT816(0),auVar19);
      in_XMM10 = minps(auVar16,auVar15);
      local_58._4_4_ = (int)in_XMM10._4_4_;
      local_58._0_4_ = (int)in_XMM10._0_4_;
      local_58._8_4_ = (int)in_XMM10._8_4_;
      local_58._12_4_ = (int)in_XMM10._12_4_;
      local_38[8] = local_38[8] + local_38[4] + fVar7;
      local_38[9] = local_38[9] + local_38[5] + fVar7;
      local_38[10] = local_38[10] + local_38[6] + fVar7;
      local_38[0xb] = local_38[0xb] + local_38[7] + fVar7;
      local_38[4] = local_38[4] + fVar6;
      local_38[5] = local_38[5] + fVar6;
      local_38[6] = local_38[6] + fVar6;
      local_38[7] = local_38[7] + fVar6;
      local_38[0] = local_38[0] + fVar8;
      local_38[1] = local_38[1] + fVar8;
      local_38[2] = local_38[2] + fVar8;
      local_38[3] = local_38[3] + fVar8;
      lVar5 = 0;
      do {
        *(uint *)((long)buffer + lVar5) =
             (*(uint *)((long)local_48 + lVar5) | uVar4) &
             (data->field_23).gradient.colorTable32[*(int *)(local_58 + lVar5)];
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x10);
      buffer = buffer + 4;
    } while (buffer < end);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void fetch(uint *buffer, uint *end, const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        typename Simd::Vect_buffer_f det_vec;
        typename Simd::Vect_buffer_f delta_det4_vec;
        typename Simd::Vect_buffer_f b_vec;

        for (int i = 0; i < 4; ++i) {
            det_vec.f[i] = det;
            delta_det4_vec.f[i] = 4 * delta_det;
            b_vec.f[i] = b;

            det += delta_det;
            delta_det += delta_delta_det;
            b += delta_b;
        }

        const typename Simd::Float32x4 v_delta_delta_det16 = Simd::v_dup(16 * delta_delta_det);
        const typename Simd::Float32x4 v_delta_delta_det6 = Simd::v_dup(6 * delta_delta_det);
        const typename Simd::Float32x4 v_delta_b4 = Simd::v_dup(4 * delta_b);

        const typename Simd::Float32x4 v_r0 = Simd::v_dup(data->gradient.radial.focal.radius);
        const typename Simd::Float32x4 v_dr = Simd::v_dup(op->radial.dr);

#if defined(__ARM_NEON__)
        // NEON doesn't have SIMD sqrt, but uses rsqrt instead that can't be taken of 0.
        const typename Simd::Float32x4 v_min = Simd::v_dup(std::numeric_limits<float>::epsilon());
#else
        const typename Simd::Float32x4 v_min = Simd::v_dup(0.0f);
#endif
        const typename Simd::Float32x4 v_max = Simd::v_dup(float(GRADIENT_STOPTABLE_SIZE-1));
        const typename Simd::Float32x4 v_half = Simd::v_dup(0.5f);

        const typename Simd::Int32x4 v_repeat_mask = Simd::v_dup(~(uint(0xffffff) << GRADIENT_STOPTABLE_SIZE_SHIFT));
        const typename Simd::Int32x4 v_reflect_mask = Simd::v_dup(~(uint(0xffffff) << (GRADIENT_STOPTABLE_SIZE_SHIFT+1)));

        const typename Simd::Int32x4 v_reflect_limit = Simd::v_dup(2 * GRADIENT_STOPTABLE_SIZE - 1);

        const int extended_mask = op->radial.extended ? 0x0 : ~0x0;

#define FETCH_RADIAL_LOOP_PROLOGUE \
        while (buffer < end) { \
            typename Simd::Vect_buffer_i v_buffer_mask; \
            v_buffer_mask.v = Simd::v_greaterOrEqual(det_vec.v, v_min); \
            const typename Simd::Float32x4 v_index_local = Simd::v_sub(Simd::v_sqrt(Simd::v_max(v_min, det_vec.v)), b_vec.v); \
            const typename Simd::Float32x4 v_index = Simd::v_add(Simd::v_mul(v_index_local, v_max), v_half); \
            v_buffer_mask.v = Simd::v_and(v_buffer_mask.v, Simd::v_greaterOrEqual(Simd::v_add(v_r0, Simd::v_mul(v_dr, v_index_local)), v_min)); \
            typename Simd::Vect_buffer_i index_vec;
#define FETCH_RADIAL_LOOP_CLAMP_REPEAT \
            index_vec.v = Simd::v_and(v_repeat_mask, Simd::v_toInt(v_index));
#define FETCH_RADIAL_LOOP_CLAMP_REFLECT \
            const typename Simd::Int32x4 v_index_i = Simd::v_and(v_reflect_mask, Simd::v_toInt(v_index)); \
            const typename Simd::Int32x4 v_index_i_inv = Simd::v_sub(v_reflect_limit, v_index_i); \
            index_vec.v = Simd::v_min_16(v_index_i, v_index_i_inv);
#define FETCH_RADIAL_LOOP_CLAMP_PAD \
            index_vec.v = Simd::v_toInt(Simd::v_min(v_max, Simd::v_max(v_min, v_index)));
#define FETCH_RADIAL_LOOP_EPILOGUE \
            det_vec.v = Simd::v_add(Simd::v_add(det_vec.v, delta_det4_vec.v), v_delta_delta_det6); \
            delta_det4_vec.v = Simd::v_add(delta_det4_vec.v, v_delta_delta_det16); \
            b_vec.v = Simd::v_add(b_vec.v, v_delta_b4); \
            for (int i = 0; i < 4; ++i) \
                *buffer++ = (extended_mask | v_buffer_mask.i[i]) & data->gradient.colorTable32[index_vec.i[i]]; \
        }

#define FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP) \
        FETCH_RADIAL_LOOP_PROLOGUE \
        FETCH_RADIAL_LOOP_CLAMP \
        FETCH_RADIAL_LOOP_EPILOGUE

        switch (data->gradient.spread) {
        case QGradient::RepeatSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_REPEAT)
            break;
        case QGradient::ReflectSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_REFLECT)
            break;
        case QGradient::PadSpread:
            FETCH_RADIAL_LOOP(FETCH_RADIAL_LOOP_CLAMP_PAD)
            break;
        default:
            Q_UNREACHABLE();
        }
    }